

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  ostream *poVar1;
  cmState *this_00;
  pointer ppVar2;
  char *pcVar3;
  cmListFileContext lfc;
  cmOutputConverter converter;
  allocator local_e9;
  cmTarget *local_e8;
  ostream *local_e0;
  cmListFileContext local_d8;
  string local_90;
  cmOutputConverter local_70;
  string local_50;
  
  pcVar3 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar3 = "keyword";
  }
  local_e0 = s;
  poVar1 = std::operator<<(s,"The uses of the ");
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1," signature are here:\n");
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmOutputConverter::cmOutputConverter(&local_70,(cmStateSnapshot *)&local_d8);
  local_e8 = this;
  for (ppVar2 = (this->TLLCommands).
                super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != (this->TLLCommands).
                super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    if (ppVar2->first == sig) {
      cmListFileContext::cmListFileContext(&local_d8,&ppVar2->second);
      this_00 = cmMakefile::GetState(this->Makefile);
      pcVar3 = cmState::GetSourceDirectory(this_00);
      std::__cxx11::string::string((string *)&local_90,pcVar3,&local_e9);
      cmOutputConverter::ConvertToRelativePath(&local_50,&local_70,&local_90,&local_d8.FilePath);
      std::__cxx11::string::operator=((string *)&local_d8.FilePath,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      poVar1 = std::operator<<(local_e0," * ");
      poVar1 = operator<<(poVar1,&local_d8);
      std::endl<char,std::char_traits<char>>(poVar1);
      cmListFileContext::~cmListFileContext(&local_d8);
      this = local_e8;
    }
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  typedef std::vector<std::pair<TLLSignature, cmListFileContext> > Container;
  cmOutputConverter converter(this->GetMakefile()->GetStateSnapshot());
  for (Container::const_iterator it = this->TLLCommands.begin();
       it != this->TLLCommands.end(); ++it) {
    if (it->first == sig) {
      cmListFileContext lfc = it->second;
      lfc.FilePath = converter.ConvertToRelativePath(
        this->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << std::endl;
    }
  }
}